

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void __thiscall APlayerPawn::CheckWeaponSwitch(APlayerPawn *this,PClassAmmo *ammotype)

{
  player_t *ppVar1;
  AWeapon *pAVar2;
  bool bVar3;
  AWeapon *pAVar4;
  
  bVar3 = userinfo_t::GetNeverSwitch(&((this->super_AActor).player)->userinfo);
  if (((!bVar3) &&
      (ppVar1 = (this->super_AActor).player,
      ppVar1->PendingWeapon == (AWeapon *)AWeapon::RegistrationInfo.MyClass)) &&
     ((pAVar4 = ppVar1->ReadyWeapon, pAVar4 == (AWeapon *)0x0 ||
      (((pAVar4->super_AStateProvider).super_AInventory.field_0x4fd & 2) != 0)))) {
    pAVar4 = BestWeapon(this,ammotype);
    if (pAVar4 != (AWeapon *)0x0) {
      ppVar1 = (this->super_AActor).player;
      pAVar2 = ppVar1->ReadyWeapon;
      if ((pAVar2 == (AWeapon *)0x0) || (pAVar4->SelectionOrder < pAVar2->SelectionOrder)) {
        ppVar1->PendingWeapon = pAVar4;
      }
    }
  }
  return;
}

Assistant:

void APlayerPawn::CheckWeaponSwitch(PClassAmmo *ammotype)
{
	if (!player->userinfo.GetNeverSwitch() &&
		player->PendingWeapon == WP_NOCHANGE && 
		(player->ReadyWeapon == NULL ||
		 (player->ReadyWeapon->WeaponFlags & WIF_WIMPY_WEAPON)))
	{
		AWeapon *best = BestWeapon (ammotype);
		if (best != NULL && (player->ReadyWeapon == NULL ||
			best->SelectionOrder < player->ReadyWeapon->SelectionOrder))
		{
			player->PendingWeapon = best;
		}
	}
}